

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsets.hpp
# Opt level: O3

iterator_range<burst::subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>_>
* __thiscall
burst::subsets<std::initializer_list<int>&,std::greater<void>>
          (iterator_range<burst::subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>_>
           *__return_storage_ptr__,burst *this)

{
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  *End;
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  local_e8;
  int *local_a8;
  int *piStack_a0;
  pointer local_98;
  pointer ppiStack_90;
  pointer local_88;
  difference_type dStack_80;
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  local_68;
  
  End = *(subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
          **)(this + 8);
  subset_iterator<const_int_*,_std::greater<void>,_std::vector<const_int_*,_std::allocator<const_int_*>_>_>
  ::subset_iterator(&local_68,*(long *)this,*(long *)this + (long)End * 4);
  local_a8 = local_68.m_begin;
  piStack_a0 = local_68.m_end;
  local_98 = local_68.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  ppiStack_90 = local_68.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  local_88 = local_68.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl
             .super__Vector_impl_data._M_end_of_storage;
  dStack_80 = local_68.m_subset_size;
  local_68.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.m_begin = local_68.m_begin;
  local_e8.m_end = local_68.m_end;
  local_e8.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.m_subset_size = 0;
  boost::
  make_iterator_range<burst::subset_iterator<int_const*,std::greater<void>,std::vector<int_const*,std::allocator<int_const*>>>>
            (__return_storage_ptr__,(boost *)&local_a8,&local_e8,End);
  if (local_e8.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.m_subset.
                          super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.m_subset.
                          super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98 != (pointer)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  if (local_68.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.m_subset.super__Vector_base<const_int_*,_std::allocator<const_int_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.m_subset.
                          super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.m_subset.
                          super__Vector_base<const_int_*,_std::allocator<const_int_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

auto subsets (ForwardRange && range, Compare compare)
    {
        auto begin = make_subset_iterator(std::forward<ForwardRange>(range), compare);
        auto end = make_subset_iterator(iterator::end_tag, begin);

        return boost::make_iterator_range(std::move(begin), std::move(end));
    }